

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2CPSInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  DecodeStatus local_44;
  int imm;
  DecodeStatus S;
  uint mode;
  uint iflags;
  uint M;
  uint imod;
  void *Decoder_local;
  uint64_t Address_local;
  uint Insn_local;
  MCInst *Inst_local;
  
  uVar1 = fieldFromInstruction_4(Insn,9,2);
  uVar2 = fieldFromInstruction_4(Insn,8,1);
  uVar3 = fieldFromInstruction_4(Insn,5,3);
  uVar4 = fieldFromInstruction_4(Insn,0,5);
  local_44 = MCDisassembler_Success;
  if (uVar1 == 1) {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    if ((uVar1 == 0) || (uVar2 == 0)) {
      if ((uVar1 == 0) || (uVar2 != 0)) {
        if ((uVar1 == 0) && (uVar2 != 0)) {
          MCInst_setOpcode(Inst,0x90f);
          MCOperand_CreateImm0(Inst,(ulong)uVar4);
          if (uVar3 != 0) {
            local_44 = MCDisassembler_SoftFail;
          }
        }
        else {
          uVar1 = fieldFromInstruction_4(Insn,0,8);
          if (4 < (int)uVar1) {
            return MCDisassembler_Fail;
          }
          MCInst_setOpcode(Inst,0x921);
          MCOperand_CreateImm0(Inst,(long)(int)uVar1);
        }
      }
      else {
        MCInst_setOpcode(Inst,0x910);
        MCOperand_CreateImm0(Inst,(ulong)uVar1);
        MCOperand_CreateImm0(Inst,(ulong)uVar3);
        if (uVar4 != 0) {
          local_44 = MCDisassembler_SoftFail;
        }
      }
    }
    else {
      MCInst_setOpcode(Inst,0x911);
      MCOperand_CreateImm0(Inst,(ulong)uVar1);
      MCOperand_CreateImm0(Inst,(ulong)uVar3);
      MCOperand_CreateImm0(Inst,(ulong)uVar4);
    }
    Inst_local._4_4_ = local_44;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeT2CPSInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	unsigned imod = fieldFromInstruction_4(Insn, 9, 2);
	unsigned M = fieldFromInstruction_4(Insn, 8, 1);
	unsigned iflags = fieldFromInstruction_4(Insn, 5, 3);
	unsigned mode = fieldFromInstruction_4(Insn, 0, 5);

	DecodeStatus S = MCDisassembler_Success;

	// imod == '01' --> UNPREDICTABLE
	// NOTE: Even though this is technically UNPREDICTABLE, we choose to
	// return failure here.  The '01' imod value is unprintable, so there's
	// nothing useful we could do even if we returned UNPREDICTABLE.

	if (imod == 1) return MCDisassembler_Fail;

	if (imod && M) {
		MCInst_setOpcode(Inst, ARM_t2CPS3p);
		MCOperand_CreateImm0(Inst, imod);
		MCOperand_CreateImm0(Inst, iflags);
		MCOperand_CreateImm0(Inst, mode);
	} else if (imod && !M) {
		MCInst_setOpcode(Inst, ARM_t2CPS2p);
		MCOperand_CreateImm0(Inst, imod);
		MCOperand_CreateImm0(Inst, iflags);
		if (mode) S = MCDisassembler_SoftFail;
	} else if (!imod && M) {
		MCInst_setOpcode(Inst, ARM_t2CPS1p);
		MCOperand_CreateImm0(Inst, mode);
		if (iflags) S = MCDisassembler_SoftFail;
	} else {
		// imod == '00' && M == '0' --> this is a HINT instruction
		int imm = fieldFromInstruction_4(Insn, 0, 8);
		// HINT are defined only for immediate in [0..4]
		if(imm > 4) return MCDisassembler_Fail;
		MCInst_setOpcode(Inst, ARM_t2HINT);
		MCOperand_CreateImm0(Inst, imm);
	}

	return S;
}